

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
* __thiscall
pstore::json::details::array_matcher<pstore::json::null_output>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
           *__return_storage_ptr__,array_matcher<pstore::json::null_output> *this,
          parser<pstore::json::null_output> *parser,maybe<char,_void> *ch)

{
  maybe<char,_void> *pmVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  null_output *this_00;
  error_code eVar6;
  bool local_e1;
  void *local_e0;
  error_code local_d8;
  bool local_c1;
  matcher<pstore::json::null_output> local_c0;
  bool local_a9;
  matcher<pstore::json::null_output> local_a8;
  bool local_91;
  matcher<pstore::json::null_output> local_90 [2];
  bool local_69;
  matcher<pstore::json::null_output> local_68;
  error_code local_58;
  char local_42;
  bool local_41;
  char c;
  void *pvStack_40;
  error_code local_38;
  maybe<char,_void> *local_28;
  maybe<char,_void> *ch_local;
  parser<pstore::json::null_output> *parser_local;
  array_matcher<pstore::json::null_output> *this_local;
  
  local_28 = ch;
  ch_local = (maybe<char,_void> *)parser;
  parser_local = (parser<pstore::json::null_output> *)this;
  this_local = (array_matcher<pstore::json::null_output> *)__return_storage_ptr__;
  bVar2 = maybe::operator_cast_to_bool((maybe *)ch);
  pmVar1 = ch_local;
  if (!bVar2) {
    std::error_code::error_code<pstore::json::error_code,void>(&local_38,expected_array_member);
    matcher<pstore::json::null_output>::set_error
              (&this->super_matcher<pstore::json::null_output>,
               (parser<pstore::json::null_output> *)pmVar1,&local_38);
    pvStack_40 = (void *)0x0;
    local_41 = true;
    std::
    pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
    ::pair<std::nullptr_t,_bool,_true>(__return_storage_ptr__,&stack0xffffffffffffffc0,&local_41);
    return __return_storage_ptr__;
  }
  pcVar5 = maybe<char,_void>::operator*(ch);
  local_42 = *pcVar5;
  iVar3 = matcher<pstore::json::null_output>::get_state
                    (&this->super_matcher<pstore::json::null_output>);
  pmVar1 = ch_local;
  switch(iVar3) {
  case 1:
    assert_failed("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x4c6);
  case 2:
    if (local_42 != '[') {
      assert_failed("c == \'[\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x4a3);
    }
    this_00 = parser<pstore::json::null_output>::callbacks
                        ((parser<pstore::json::null_output> *)ch_local);
    eVar6 = null_output::begin_array(this_00);
    local_58._M_cat = eVar6._M_cat;
    local_58._M_value = eVar6._M_value;
    bVar2 = matcher<pstore::json::null_output>::set_error
                      (&this->super_matcher<pstore::json::null_output>,
                       (parser<pstore::json::null_output> *)pmVar1,&local_58);
    if (!bVar2) {
      matcher<pstore::json::null_output>::set_state
                (&this->super_matcher<pstore::json::null_output>,3);
      matcher<pstore::json::null_output>::make_whitespace_matcher
                (&local_68,(parser<pstore::json::null_output> *)this);
      local_69 = true;
      std::
      pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
      ::
      pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool,_true>
                (__return_storage_ptr__,
                 (unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
                  *)&local_68,&local_69);
      std::
      unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
      ::~unique_ptr((unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
                     *)&local_68);
      return __return_storage_ptr__;
    }
    break;
  case 3:
    if (local_42 != ']') goto switchD_001fe50c_caseD_4;
    end_array(this,(parser<pstore::json::null_output> *)ch_local);
    break;
  case 4:
switchD_001fe50c_caseD_4:
    matcher<pstore::json::null_output>::set_state(&this->super_matcher<pstore::json::null_output>,5)
    ;
    matcher<pstore::json::null_output>::make_root_matcher
              (local_90,(parser<pstore::json::null_output> *)this,SUB81(ch_local,0));
    local_91 = false;
    std::
    pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
    ::
    pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool,_true>
              (__return_storage_ptr__,
               (unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
                *)local_90,&local_91);
    std::
    unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
    ::~unique_ptr((unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
                   *)local_90);
    return __return_storage_ptr__;
  case 5:
    uVar4 = isspace((int)local_42);
    pmVar1 = ch_local;
    if ((uVar4 & 1) != 0) {
      matcher<pstore::json::null_output>::make_whitespace_matcher
                (&local_a8,(parser<pstore::json::null_output> *)this);
      local_a9 = false;
      std::
      pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
      ::
      pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool,_true>
                (__return_storage_ptr__,
                 (unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
                  *)&local_a8,&local_a9);
      std::
      unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
      ::~unique_ptr((unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
                     *)&local_a8);
      return __return_storage_ptr__;
    }
    if (local_42 == ',') {
      bVar2 = parser<pstore::json::null_output>::extension_enabled
                        ((parser<pstore::json::null_output> *)ch_local,array_trailing_comma);
      matcher<pstore::json::null_output>::set_state
                (&this->super_matcher<pstore::json::null_output>,4 - (uint)bVar2);
      matcher<pstore::json::null_output>::make_whitespace_matcher
                (&local_c0,(parser<pstore::json::null_output> *)this);
      local_c1 = true;
      std::
      pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
      ::
      pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool,_true>
                (__return_storage_ptr__,
                 (unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
                  *)&local_c0,&local_c1);
      std::
      unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
      ::~unique_ptr((unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
                     *)&local_c0);
      return __return_storage_ptr__;
    }
    if (local_42 == ']') {
      end_array(this,(parser<pstore::json::null_output> *)ch_local);
    }
    else {
      std::error_code::error_code<pstore::json::error_code,void>(&local_d8,expected_array_member);
      matcher<pstore::json::null_output>::set_error
                (&this->super_matcher<pstore::json::null_output>,
                 (parser<pstore::json::null_output> *)pmVar1,&local_d8);
    }
  }
  local_e0 = (void *)0x0;
  local_e1 = true;
  std::
  pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
  ::pair<std::nullptr_t,_bool,_true>(__return_storage_ptr__,&local_e0,&local_e1);
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            array_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (!ch) {
                    this->set_error (parser, error_code::expected_array_member);
                    return {nullptr, true};
                }
                char const c = *ch;
                switch (this->get_state ()) {
                case start_state:
                    PSTORE_ASSERT (c == '[');
                    if (this->set_error (parser, parser.callbacks ().begin_array ())) {
                        break;
                    }
                    this->set_state (first_object_state);
                    // Match this character and consume whitespace before the object (or close
                    // bracket).
                    return {this->make_whitespace_matcher (parser), true};

                case first_object_state:
                    if (c == ']') {
                        this->end_array (parser);
                        break;
                    }
                    PSTORE_FALLTHROUGH;
                case object_state:
                    this->set_state (comma_state);
                    return {this->make_root_matcher (parser), false};
                    break;
                case comma_state:
                    if (isspace (c)) {
                        // just consume whitespace before a comma.
                        return {this->make_whitespace_matcher (parser), false};
                    }
                    switch (c) {
                    case ',':
                        this->set_state (
                            (parser.extension_enabled (extensions::array_trailing_comma))
                                ? first_object_state
                                : object_state);
                        return {this->make_whitespace_matcher (parser), true};
                    case ']': this->end_array (parser); break;
                    default: this->set_error (parser, error_code::expected_array_member); break;
                    }
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                return {nullptr, true};
            }